

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O2

float __thiscall Randomizer::randSpawnRnd(Randomizer *this)

{
  result_type_conflict rVar1;
  
  rVar1 = std::uniform_real_distribution<float>::operator()(this->RespawnRnd,this->RndCore);
  return rVar1;
}

Assistant:

float Randomizer::randSpawnRnd()
{
    return (*RespawnRnd)(*RndCore);
}